

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

void Gia_QbfDumpFile(Gia_Man_t *pGia,int nPars)

{
  int iVar1;
  Cnf_Dat_t *p;
  void *__s;
  Vec_Int_t *vForAlls;
  int *piVar2;
  Vec_Int_t *pVVar3;
  char *pFileName;
  long lVar4;
  int iVar5;
  Vec_Int_t *p_00;
  
  __s = (void *)0x0;
  p = Mf_ManGenerateCnf(pGia,8,0,1,0);
  iVar1 = p->nVars;
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  if (iVar5 != 0) {
    __s = malloc((long)iVar5 << 2);
  }
  memset(__s,0,(long)iVar1 * 4);
  pVVar3 = pGia->vCis;
  if (0 < pVVar3->nSize) {
    piVar2 = pVVar3->pArray;
    lVar4 = 0;
    do {
      iVar5 = piVar2[lVar4];
      if (((long)iVar5 < 0) || (pGia->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      if (lVar4 < nPars) {
        iVar5 = p->pVarNums[iVar5];
        if (((long)iVar5 < 0) || (iVar1 <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)((long)__s + (long)iVar5 * 4) = 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->nSize);
  }
  vForAlls = (Vec_Int_t *)malloc(0x10);
  iVar5 = nPars;
  if (nPars - 1U < 0xf) {
    iVar5 = 0x10;
  }
  vForAlls->nSize = 0;
  vForAlls->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  vForAlls->pArray = piVar2;
  iVar5 = pVVar3->nSize - nPars;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  if (iVar5 - 1U < 0xf) {
    iVar5 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar3->pArray = piVar2;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      p_00 = pVVar3;
      if (*(int *)((long)__s + lVar4 * 4) != 0) {
        p_00 = vForAlls;
      }
      Vec_IntPush(p_00,(int)lVar4);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  pFileName = Extra_FileNameGenericAppend(pGia->pSpec,".qdimacs");
  Cnf_DataWriteIntoFile(p,pFileName,0,vForAlls,pVVar3);
  Cnf_DataFree(p);
  if (vForAlls->pArray != (int *)0x0) {
    free(vForAlls->pArray);
    vForAlls->pArray = (int *)0x0;
  }
  free(vForAlls);
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  free(pVVar3);
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("The 2QBF formula was written into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_QbfDumpFile( Gia_Man_t * pGia, int nPars )
{
    // original problem: \exists p \forall x \exists y.  M(p,x,y)
    // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( pGia, 8, 0, 1, 0 );
    Vec_Int_t * vVarMap, * vForAlls, * vExists;
    Gia_Obj_t * pObj;
    char * pFileName;
    int i, Entry;
    // create var map
    vVarMap = Vec_IntStart( pCnf->nVars );
    Gia_ManForEachCi( pGia, pObj, i )
        if ( i < nPars )
            Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Gia_ManCiIdToId(pGia, i)], 1 );
    // create various maps
    vForAlls = Vec_IntAlloc( nPars );
    vExists = Vec_IntAlloc( Gia_ManCiNum(pGia) - nPars );
    Vec_IntForEachEntry( vVarMap, Entry, i )
        if ( Entry )
            Vec_IntPush( vForAlls, i );
        else
            Vec_IntPush( vExists, i );
    // generate CNF
    pFileName = Extra_FileNameGenericAppend( pGia->pSpec, ".qdimacs" );
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vForAlls );
    Vec_IntFree( vExists );
    Vec_IntFree( vVarMap );
    printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
}